

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astDownCastNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  ulong uStack_70;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 6;
  puStack_30 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_98 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x18) = sVar2;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_98 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sStack_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_98 + 0x28),(context->roots).typeType,
                         arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x28) = sStack_90;
  _Var1 = sysbvm_astNode_isLiteralNode(context,sStack_90);
  if (_Var1) {
    sStack_80 = sysbvm_astLiteralNode_getValue(sStack_90);
  }
  else {
    if ((sStack_90 & 0xf) == 0 && sStack_90 != 0) {
      local_88 = *(sysbvm_tuple_t *)(sStack_90 + 0x20);
    }
    else {
      local_88 = 0;
    }
    sStack_80 = sysbvm_type_getCanonicalPendingInstanceType(context,local_88);
  }
  local_78 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,*(sysbvm_tuple_t *)(local_98 + 0x30),0,arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x30) = local_78;
  if (sStack_80 == 0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:835: assertion failure: gcFrame.type"
              );
  }
  *(sysbvm_tuple_t *)(local_98 + 0x20) = sStack_80;
  if (_Var1) {
    if ((local_78 & 0xf) == 0 && local_78 != 0) {
      uStack_70 = *(ulong *)(local_78 + 0x20);
    }
    else {
      uStack_70 = 0;
    }
    if ((((sStack_80 & 0xf) == 0 && sStack_80 != 0) && ((uStack_70 & 0xf) == 0 && uStack_70 != 0))
       && (uVar3 = uStack_70, (*(byte *)(uStack_70 + 8) & 0x80) == 0)) {
      do {
        if (uVar3 == sStack_80) {
          sysbvm_stackFrame_popRecord(&local_60);
          sysbvm_stackFrame_popRecord(&local_48);
          return local_78;
        }
        uVar3 = *(ulong *)(uVar3 + 0x30);
      } while (uVar3 != 0);
    }
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_98;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDownCastNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astDownCastNode_t *downCastNode;
        sysbvm_tuple_t typeExpression;
        sysbvm_tuple_t typeExpressionType;
        sysbvm_tuple_t type;

        sysbvm_tuple_t valueExpression;
        sysbvm_tuple_t valueExpressionType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.downCastNode = (sysbvm_astDownCastNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.downCastNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.downCastNode->super.sourcePosition);

    gcFrame.typeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.downCastNode->typeExpression, context->roots.typeType, *environment);
    gcFrame.downCastNode->typeExpression = gcFrame.typeExpression;
    bool hasLiteralType = sysbvm_astNode_isLiteralNode(context, gcFrame.typeExpression);
    if(hasLiteralType)
    {
        gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.typeExpression);
    }
    else
    {
        gcFrame.typeExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.typeExpression);
        gcFrame.type = sysbvm_type_getCanonicalPendingInstanceType(context, gcFrame.typeExpressionType);
    }

    gcFrame.valueExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.downCastNode->valueExpression, *environment);
    gcFrame.downCastNode->valueExpression = gcFrame.valueExpression;
    SYSBVM_ASSERT(gcFrame.type);
    gcFrame.downCastNode->super.analyzedType = gcFrame.type;

    // Is this already a value with the expected type?
    if(hasLiteralType)
    {
        gcFrame.valueExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.valueExpression);
        if(sysbvm_type_isDirectSubtypeOf(gcFrame.valueExpressionType, gcFrame.type))
        {
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (sysbvm_tuple_t)gcFrame.valueExpression;
        }
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.downCastNode;
}